

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cpp
# Opt level: O0

void BubbleSort(vector<int,_std::allocator<int>_> *sortArray)

{
  int iVar1;
  value_type vVar2;
  value_type vVar3;
  clock_t cVar4;
  size_type sVar5;
  reference pvVar6;
  clock_t cVar7;
  ostream *poVar8;
  int local_20;
  int iStack_1c;
  char tmp;
  int j;
  int i;
  clock_t t;
  vector<int,_std::allocator<int>_> *sortArray_local;
  
  cVar4 = clock();
  sVar5 = std::vector<int,_std::allocator<int>_>::size(sortArray);
  iStack_1c = (int)sVar5;
  while (iStack_1c = iStack_1c + -1, -1 < iStack_1c) {
    for (local_20 = 0; local_20 < iStack_1c; local_20 = local_20 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::at(sortArray,(long)local_20);
      iVar1 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::at(sortArray,(long)(local_20 + 1));
      if (*pvVar6 <= iVar1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::at(sortArray,(long)local_20);
        iVar1 = *pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::at(sortArray,(long)(local_20 + 1));
        if (iVar1 != *pvVar6) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::at(sortArray,(long)local_20);
          vVar2 = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::at(sortArray,(long)(local_20 + 1));
          vVar3 = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::at(sortArray,(long)local_20);
          *pvVar6 = vVar3;
          pvVar6 = std::vector<int,_std::allocator<int>_>::at(sortArray,(long)(local_20 + 1));
          *pvVar6 = (int)(char)vVar2;
        }
      }
    }
  }
  cVar7 = clock();
  poVar8 = std::operator<<((ostream *)&std::cout,"Total time was ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,cVar7 - cVar4);
  poVar8 = std::operator<<(poVar8," processor cycles.");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void BubbleSort(std::vector<int> *sortArray)
{
    std::clock_t t;
    t = clock();
    for(int i = sortArray->size() - 1; i > - 1; i--)
    {
        for(int j = 0; j < i; j++)
        {
            if(sortArray->at(j) < sortArray->at(j + 1) || sortArray->at(j) == sortArray->at(j + 1))
            {
                continue;
            }
            else
            {
                char tmp = sortArray->at(j);
                sortArray->at(j) = sortArray->at(j + 1);
                sortArray->at(j + 1) = tmp;
            }
        }
    }

    t = clock() - t;
    std::cout << "Total time was " << t << " processor cycles." << std::endl;
}